

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue val;
  int iVar1;
  undefined8 in_RAX;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSRefCountHeader *p_1;
  JSValueUnion JVar5;
  JSRefCountHeader *p;
  int64_t iVar6;
  JSValueUnion *pJVar7;
  JSValue this_obj;
  JSValue JVar8;
  JSValue prop;
  JSValue val_00;
  JSValue val_01;
  uint32_t len;
  
  len = (uint32_t)((ulong)in_RAX >> 0x20);
  this_obj = js_create_from_ctor(ctx,new_target,2);
  JVar2 = this_obj.u;
  if ((uint)this_obj.tag != 6) {
    if (argc == 1) {
      iVar1 = (int)argv->tag;
      if ((iVar1 == 7) || (iVar1 == 0)) {
        val_00.tag = argv->tag;
        val_00.u.ptr = (argv->u).ptr;
        iVar1 = JS_ToArrayLengthFree(ctx,&len,val_00,1);
        if (iVar1 == 0) {
          JVar3 = (JSValueUnion)(long)(int)len;
          JVar5.float64 = (double)len;
          if (-1 < (long)JVar3.ptr) {
            JVar5 = JVar3;
          }
          iVar6 = 7;
          if (-1 < (long)JVar3.ptr) {
            iVar6 = 0;
          }
          val_01.tag = iVar6;
          val_01.u.float64 = JVar5.float64;
          iVar1 = JS_SetPropertyInternal(ctx,this_obj,0x30,val_01,0x4000);
          if (-1 < iVar1) goto LAB_0013092e;
        }
LAB_00130972:
        if ((0xfffffff4 < (uint)this_obj.tag) &&
           (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,this_obj);
        }
        uVar4 = 0;
        this_obj = (JSValue)(ZEXT816(6) << 0x40);
        goto LAB_0013099d;
      }
    }
    else if (argc < 1) goto LAB_0013092e;
    pJVar7 = (JSValueUnion *)&argv->tag;
    uVar4 = 0;
    do {
      JVar5 = pJVar7[-1];
      JVar3 = *pJVar7;
      if (0xfffffff4 < (uint)JVar3.int32) {
        *(int *)JVar5.ptr = *JVar5.ptr + 1;
      }
      val.tag = 0x4000;
      val.u.float64 = JVar3.float64;
      prop.tag = 0;
      prop.u.ptr = (void *)uVar4;
      iVar1 = JS_SetPropertyValue(ctx,this_obj,prop,val,JVar5.int32);
      if (iVar1 < 0) goto LAB_00130972;
      uVar4 = uVar4 + 1;
      pJVar7 = pJVar7 + 2;
    } while ((uint)argc != uVar4);
  }
LAB_0013092e:
  uVar4 = (ulong)JVar2.ptr & 0xffffffff00000000;
LAB_0013099d:
  JVar8.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar4);
  JVar8.tag = this_obj.tag;
  return JVar8;
}

Assistant:

static JSValue js_array_constructor(JSContext *ctx, JSValueConst new_target,
                                    int argc, JSValueConst *argv)
{
    JSValue obj;
    int i;

    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_ARRAY);
    if (JS_IsException(obj))
        return obj;
    if (argc == 1 && JS_IsNumber(argv[0])) {
        uint32_t len;
        if (JS_ToArrayLengthFree(ctx, &len, JS_DupValue(ctx, argv[0]), TRUE))
            goto fail;
        if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewUint32(ctx, len)) < 0)
            goto fail;
    } else {
        for(i = 0; i < argc; i++) {
            if (JS_SetPropertyUint32(ctx, obj, i, JS_DupValue(ctx, argv[i])) < 0)
                goto fail;
        }
    }
    return obj;
fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}